

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void ImGuiStb::stb_textedit_click(ImGuiInputTextState *str,STB_TexteditState *state,float x,float y)

{
  ImWchar *text_begin;
  int iVar1;
  bool in_R8B;
  ImWchar *local_18;
  
  if (state->single_line != '\0') {
    text_begin = (str->TextW).Data;
    InputTextCalcTextSizeW(text_begin,text_begin + str->CurLenW,&local_18,(ImVec2 *)0x1,in_R8B);
    y = 0.0;
  }
  iVar1 = stb_text_locate_coord(str,x,y);
  state->cursor = iVar1;
  state->select_start = iVar1;
  state->select_end = iVar1;
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_click(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, float x, float y)
{
   // In single-line mode, just always make y = 0. This lets the drag keep working if the mouse
   // goes off the top or bottom of the text
   if( state->single_line )
   {
      StbTexteditRow r;
      STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
      y = r.ymin;
   }

   state->cursor = stb_text_locate_coord(str, x, y);
   state->select_start = state->cursor;
   state->select_end = state->cursor;
   state->has_preferred_x = 0;
}